

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderCustomData.cpp
# Opt level: O0

bool Assimp::Blender::read<Assimp::Blender::MLoop>
               (Structure *s,MLoop *p,size_t cnt,FileDatabase *db)

{
  undefined1 local_48 [8];
  MLoop read;
  size_t i;
  FileDatabase *db_local;
  size_t cnt_local;
  MLoop *p_local;
  Structure *s_local;
  
  read.v = 0;
  read.e = 0;
  cnt_local = (size_t)p;
  for (; (ulong)read._16_8_ < cnt; read._16_8_ = read._16_8_ + 1) {
    MLoop::MLoop((MLoop *)local_48);
    Structure::Convert<Assimp::Blender::MLoop>(s,(MLoop *)local_48,db);
    MLoop::operator=((MLoop *)cnt_local,(MLoop *)local_48);
    cnt_local = cnt_local + 0x18;
    MLoop::~MLoop((MLoop *)local_48);
  }
  return true;
}

Assistant:

bool read(const Structure &s, T *p, const size_t cnt, const FileDatabase &db) {
            for (size_t i = 0; i < cnt; ++i) {
                T read;
                s.Convert(read, db);
                *p = read;
                p++;
            }
            return true;
        }